

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O1

bool TestLowbitsCollisions<Blob<224>>(vector<Blob<224>,_std::allocator<Blob<224>_>_> *revhashes)

{
  uint nbHBits;
  uint uVar1;
  uint uVar2;
  undefined8 in_RCX;
  undefined8 uVar3;
  int b;
  int in_ESI;
  int nbHashes;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  double in_XMM0_Qa;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double local_48;
  
  nbHashes = (int)((ulong)((long)(revhashes->
                                 super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)(revhashes->
                                super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
                                super__Vector_impl_data._M_start) >> 2) * -0x49249249;
  nbHBits = FindMinBits_TargetCollisionShare(nbHashes,in_XMM0_Qa);
  uVar1 = FindMaxBits_TargetCollisionNb(nbHashes,in_ESI);
  bVar5 = true;
  if (0xffffff20 < uVar1 - 0xe0) {
    uVar6 = 0;
    printf("Testing collisions (low  %2i-%2i bits) - ",(ulong)nbHBits,(ulong)uVar1);
    if ((int)uVar1 < (int)nbHBits) {
      dVar10 = 0.0;
      uVar3 = 1;
      uVar4 = 0;
    }
    else {
      auVar9._0_8_ = (double)nbHashes;
      uVar4 = 0;
      dVar10 = 0.0;
      local_48 = 1.0;
      uVar6 = 0;
      do {
        uVar2 = CountNbCollisions<Blob<224>>(revhashes,nbHBits);
        dVar7 = ldexp(1.0,nbHBits);
        auVar8._0_8_ = (auVar9._0_8_ * (double)(nbHashes + -1)) / dVar7;
        auVar8._8_8_ = 0;
        auVar9._8_8_ = 0;
        auVar8 = vminsd_avx(auVar9,auVar8);
        dVar7 = (double)(int)uVar2 / auVar8._0_8_;
        if (dVar10 < dVar7) {
          uVar6 = (ulong)nbHBits;
          uVar4 = uVar2;
          dVar10 = dVar7;
          local_48 = auVar8._0_8_;
        }
        nbHBits = nbHBits + 1;
      } while (uVar1 + 1 != nbHBits);
      uVar3 = CONCAT44((int)((ulong)in_RCX >> 0x20),(int)local_48);
    }
    bVar5 = true;
    printf("Worst is %2i bits: %2i/%2i (%.2fx)",dVar10,uVar6,(ulong)uVar4,uVar3);
    if (2.0 < dVar10) {
      puts(" !!!!!");
      bVar5 = false;
    }
    else {
      putchar(10);
    }
  }
  return bVar5;
}

Assistant:

bool TestLowbitsCollisions ( std::vector<hashtype> & revhashes)
{
  int origBits = sizeof(hashtype) * 8;

  size_t const nbH = revhashes.size();
  int const minBits = FindMinBits_TargetCollisionShare(nbH, 0.01);
  int const maxBits = FindMaxBits_TargetCollisionNb(nbH, 20);
  if (maxBits <= 0 || maxBits >= origBits) return true;

  printf("Testing collisions (low  %2i-%2i bits) - ", minBits, maxBits);
  double maxCollDev = 0.0;
  int maxCollDevBits = 0;
  int maxCollDevNb = 0;
  double maxCollDevExp = 1.0;

  for (int b = minBits; b <= maxBits; b++) {
      int    const nbColls = CountNbCollisions(revhashes, b);
      double const expected = EstimateNbCollisions(nbH, b);
      assert(expected > 0.0);
      double const dev = (double)nbColls / expected;
      if (dev > maxCollDev) {
          maxCollDev = dev;
          maxCollDevBits = b;
          maxCollDevNb = nbColls;
          maxCollDevExp = expected;
      }
  }

  printf("Worst is %2i bits: %2i/%2i (%.2fx)",
        maxCollDevBits, maxCollDevNb, (int)maxCollDevExp, maxCollDev);

  if (maxCollDev > 2.0) {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}